

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

bool __thiscall ui::Led::OnEvent(Led *this,Event *event)

{
  bool bVar1;
  reference __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_ofstream<char,_std::char_traits<char>_> local_270 [528];
  Event local_60;
  byte local_1d;
  int local_1c;
  bool ret;
  Event *pEStack_18;
  int trigger_selected;
  Event *event_local;
  Led *this_local;
  
  local_1c = this->trigger_selected_;
  pEStack_18 = event;
  event_local = (Event *)this;
  ftxui::Event::Event(&local_60,event);
  bVar1 = ftxui::ComponentBase::OnEvent(&this->super_ComponentBase,&local_60);
  ftxui::Event::~Event(&local_60);
  local_1d = bVar1;
  if (local_1c != this->trigger_selected_) {
    std::operator+(&local_290,&this->file_path_,"/trigger");
    std::ofstream::ofstream(local_270,(string *)&local_290,_S_out);
    __x = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->trigger_entries_,(long)this->trigger_selected_);
    std::operator<<(local_270,__x);
    std::ofstream::~ofstream(local_270);
    std::__cxx11::string::~string((string *)&local_290);
    FetchState(this);
  }
  return (bool)(local_1d & 1);
}

Assistant:

bool OnEvent(Event event) override {
    int trigger_selected = trigger_selected_;
    bool ret = ComponentBase::OnEvent(event);
    if (trigger_selected != trigger_selected_) {
      std::ofstream(file_path_ + "/trigger")
          << trigger_entries_[trigger_selected_];
      FetchState();
    }
    return ret;
  }